

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O2

int Iso_ManCheckMapping(Aig_Man_t *pAig1,Aig_Man_t *pAig2,Vec_Int_t *vMap2to1,int fVerbose)

{
  int i;
  void *pvVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pFanin1;
  int iVar4;
  uint i_00;
  
  if (pAig1->nObjs[2] != pAig2->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(pAig1) == Aig_ManCiNum(pAig2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                  ,0xbe,"int Iso_ManCheckMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int)");
  }
  if (pAig1->nObjs[3] != pAig2->nObjs[3]) {
    __assert_fail("Aig_ManCoNum(pAig1) == Aig_ManCoNum(pAig2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                  ,0xbf,"int Iso_ManCheckMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int)");
  }
  if (pAig1->nRegs != pAig2->nRegs) {
    __assert_fail("Aig_ManRegNum(pAig1) == Aig_ManRegNum(pAig2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                  ,0xc0,"int Iso_ManCheckMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int)");
  }
  if (pAig1->nObjs[6] + pAig1->nObjs[5] != pAig2->nObjs[6] + pAig2->nObjs[5]) {
    __assert_fail("Aig_ManNodeNum(pAig1) == Aig_ManNodeNum(pAig2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                  ,0xc1,"int Iso_ManCheckMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int)");
  }
  Aig_ManCleanData(pAig1);
  pAig2->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pAig1->pConst1;
  for (iVar4 = 0; iVar4 < pAig2->vCis->nSize; iVar4 = iVar4 + 1) {
    pvVar1 = Vec_PtrEntry(pAig2->vCis,iVar4);
    i = Vec_IntEntry(vMap2to1,iVar4);
    pAVar2 = Aig_ManCi(pAig1,i);
    *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar2;
  }
  i_00 = 0;
  do {
    if (pAig2->vObjs->nSize <= (int)i_00) {
      iVar4 = 1;
      if (pAig1->nObjs[3] - pAig1->nRegs == 1) {
        pAVar2 = Aig_ManCo(pAig2,0);
        pAVar2 = Aig_ObjChild0Copy(pAVar2);
        pAVar3 = Aig_ManCo(pAig1,0);
        if (pAVar2 != pAVar3->pFanin0) {
          if (fVerbose != 0) {
            puts("Structural equivalence failed at primary output 0.");
          }
LAB_005902ef:
          iVar4 = 0;
        }
      }
      return iVar4;
    }
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAig2->vObjs,i_00);
    if ((pAVar2 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar2->field_0x18 & 7) - 7)) {
      pAVar3 = Aig_ObjChild0Copy(pAVar2);
      pFanin1 = Aig_ObjChild1Copy(pAVar2);
      pAVar3 = Aig_TableLookupTwo(pAig1,pAVar3,pFanin1);
      (pAVar2->field_5).pData = pAVar3;
      if (pAVar3 == (Aig_Obj_t *)0x0) {
        if (fVerbose != 0) {
          printf("Structural equivalence failed at node %d.\n",(ulong)i_00);
          return 0;
        }
        goto LAB_005902ef;
      }
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

int Iso_ManCheckMapping( Aig_Man_t * pAig1, Aig_Man_t * pAig2, Vec_Int_t * vMap2to1, int fVerbose )
{
    Aig_Obj_t * pObj, * pFanin0, * pFanin1;
    int i;
    assert( Aig_ManCiNum(pAig1) == Aig_ManCiNum(pAig2) );
    assert( Aig_ManCoNum(pAig1) == Aig_ManCoNum(pAig2) );
    assert( Aig_ManRegNum(pAig1) == Aig_ManRegNum(pAig2) );
    assert( Aig_ManNodeNum(pAig1) == Aig_ManNodeNum(pAig2) );
    Aig_ManCleanData( pAig1 );
    // map const and PI nodes
    Aig_ManConst1(pAig2)->pData = Aig_ManConst1(pAig1);
    Aig_ManForEachCi( pAig2, pObj, i )
        pObj->pData = Aig_ManCi( pAig1, Vec_IntEntry(vMap2to1, i) );
    // try internal nodes
    Aig_ManForEachNode( pAig2, pObj, i )
    {
        pFanin0 = Aig_ObjChild0Copy( pObj );
        pFanin1 = Aig_ObjChild1Copy( pObj );
        pObj->pData = Aig_TableLookupTwo( pAig1, pFanin0, pFanin1 );
        if ( pObj->pData == NULL )
        {
            if ( fVerbose )
                printf( "Structural equivalence failed at node %d.\n", i );
            return 0;
        }
    }
    // make sure the first PO points to the same node
    if ( Aig_ManCoNum(pAig1)-Aig_ManRegNum(pAig1) == 1 && Aig_ObjChild0Copy(Aig_ManCo(pAig2, 0)) != Aig_ObjChild0(Aig_ManCo(pAig1, 0)) )
    {
        if ( fVerbose )
            printf( "Structural equivalence failed at primary output 0.\n" );
        return 0;
    }
    return 1;    
}